

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_headers_parser.h
# Opt level: O2

void __thiscall cppcms::impl::cgi_headers_parser::add_header(cgi_headers_parser *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  string local_70;
  string local_50;
  
  _Var2._M_current = (this->header_)._M_dataplus._M_p;
  end._M_current = _Var2._M_current + ((this->header_)._M_string_length - 2);
  begin = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (_Var2,end);
  p = http::protocol::tocken<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end);
  _Var1 = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(p,end);
  _Var2._M_current = end._M_current;
  if (_Var1._M_current != end._M_current) {
    _Var2 = http::protocol::skip_ws<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (_Var1._M_current + 1,end);
  }
  if ((_Var1._M_current < end._M_current && p._M_current != begin._M_current) &&
     (*_Var1._M_current == ':')) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_70,begin._M_current,p._M_current);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_50,_Var2._M_current,end._M_current);
    response_headers::add_header(&this->h_,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->h_).added_headers_,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  (this->header_)._M_string_length = 0;
  *(this->header_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void add_header()
	{
		auto start = header_.begin();
		auto end = start + header_.size() - 2;
		using namespace cppcms::http::protocol;
		start = skip_ws(start,end);
		auto key_end = tocken(start,end);
		auto colon=skip_ws(key_end,end);
		auto value_start=(colon != end) ? skip_ws(colon+1,end) : end;
		if(key_end != start && colon < end && *colon == ':')
			h_.add_header(std::string(start,key_end),std::string(value_start,end));
		else
			h_.add_header(header_.substr(0,header_.size()-2));
		header_.clear();
	}